

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.h
# Opt level: O0

void __thiscall
dynet::RNNBuilder::start_new_sequence
          (RNNBuilder *this,vector<dynet::Expression,_std::allocator<dynet::Expression>_> *h_0)

{
  RNNStateMachine *in_RSI;
  long *in_RDI;
  
  RNNStateMachine::transition(in_RSI,(RNNOp)((ulong)in_RDI >> 0x20));
  *(undefined4 *)(in_RDI + 1) = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x172a29);
  (**(code **)(*in_RDI + 0x58))(in_RDI,in_RSI);
  return;
}

Assistant:

void start_new_sequence(const std::vector<Expression>& h_0 = {}) {
    sm.transition(RNNOp::start_new_sequence);
    cur = RNNPointer(-1);
    head.clear();
    start_new_sequence_impl(h_0);
  }